

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_sort_key.cpp
# Opt level: O1

void __thiscall
duckdb::CreateSortKeyHelpers::DecodeSortKey
          (CreateSortKeyHelpers *this,string_t sort_key,Vector *result,idx_t result_idx,
          OrderModifiers modifiers)

{
  DecodeSortKeyVectorData sort_key_data;
  DecodeSortKeyData decode_data;
  undefined8 local_68;
  const_data_ptr_t local_60;
  DecodeSortKeyVectorData local_58;
  DecodeSortKeyData local_30;
  
  local_60 = sort_key.value._0_8_;
  local_68 = this;
  DecodeSortKeyVectorData::DecodeSortKeyVectorData
            (&local_58,&(sort_key.value._8_8_)->type,SUB82(result_idx,0));
  local_30.size = (ulong)local_68 & 0xffffffff;
  local_30.data = local_60;
  if (local_30.size < 0xd) {
    local_30.data = (const_data_ptr_t)((long)&local_68 + 4);
  }
  local_30.position = 0;
  DecodeSortKeyRecursive(&local_30,&local_58,sort_key.value._8_8_,(idx_t)result);
  ::std::vector<duckdb::DecodeSortKeyVectorData,_std::allocator<duckdb::DecodeSortKeyVectorData>_>::
  ~vector(&local_58.child_data.
           super_vector<duckdb::DecodeSortKeyVectorData,_std::allocator<duckdb::DecodeSortKeyVectorData>_>
         );
  return;
}

Assistant:

void CreateSortKeyHelpers::DecodeSortKey(string_t sort_key, Vector &result, idx_t result_idx,
                                         OrderModifiers modifiers) {
	DecodeSortKeyVectorData sort_key_data(result.GetType(), modifiers);
	DecodeSortKeyData decode_data(sort_key);
	DecodeSortKeyRecursive(decode_data, sort_key_data, result, result_idx);
}